

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_flags_decoder.c
# Opt level: O2

lzma_ret lzma_stream_header_decode(lzma_stream_flags *options,uint8_t *in)

{
  _Bool _Var1;
  int iVar2;
  uint32_t uVar3;
  lzma_ret lVar4;
  
  iVar2 = bcmp(in,lzma_header_magic,6);
  if (iVar2 == 0) {
    uVar3 = lzma_crc32(in + 6,2,0);
    if (uVar3 == *(uint32_t *)(in + 8)) {
      _Var1 = stream_flags_decode(options,in + 6);
      if (_Var1) {
        lVar4 = LZMA_OPTIONS_ERROR;
      }
      else {
        options->backward_size = 0xffffffffffffffff;
        lVar4 = LZMA_OK;
      }
    }
    else {
      lVar4 = LZMA_DATA_ERROR;
    }
  }
  else {
    lVar4 = LZMA_FORMAT_ERROR;
  }
  return lVar4;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_stream_header_decode(lzma_stream_flags *options, const uint8_t *in)
{
	// Magic
	if (memcmp(in, lzma_header_magic, sizeof(lzma_header_magic)) != 0)
		return LZMA_FORMAT_ERROR;

	// Verify the CRC32 so we can distinguish between corrupt
	// and unsupported files.
	const uint32_t crc = lzma_crc32(in + sizeof(lzma_header_magic),
			LZMA_STREAM_FLAGS_SIZE, 0);
	if (crc != read32le(in + sizeof(lzma_header_magic)
			+ LZMA_STREAM_FLAGS_SIZE))
		return LZMA_DATA_ERROR;

	// Stream Flags
	if (stream_flags_decode(options, in + sizeof(lzma_header_magic)))
		return LZMA_OPTIONS_ERROR;

	// Set Backward Size to indicate unknown value. That way
	// lzma_stream_flags_compare() can be used to compare Stream Header
	// and Stream Footer while keeping it useful also for comparing
	// two Stream Footers.
	options->backward_size = LZMA_VLI_UNKNOWN;

	return LZMA_OK;
}